

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O2

void __thiscall DGameplayMenu::DGameplayMenu(DGameplayMenu *this)

{
  DOptionMenu::DOptionMenu(&this->super_DOptionMenu,(DMenu *)0x0,(FOptionMenuDescriptor *)0x0);
  (this->super_DOptionMenu).super_DMenu.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_007c0718;
  return;
}

Assistant:

void Drawer ()
	{
		Super::Drawer();

		char text[64];
		mysnprintf(text, 64, "dmflags = %d   dmflags2 = %d", *dmflags, *dmflags2);
		screen->DrawText (SmallFont, OptionSettings.mFontColorValue,
			(screen->GetWidth() - SmallFont->StringWidth (text) * CleanXfac_1) / 2, 0, text,
			DTA_CleanNoMove_1, true, TAG_DONE);
	}